

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkeysequenceedit.cpp
# Opt level: O3

void __thiscall QKeySequenceEdit::keyPressEvent(QKeySequenceEdit *this,QKeyEvent *e)

{
  long lVar1;
  uint *puVar2;
  uint uVar3;
  QKeySequenceEditPrivate *this_00;
  long lVar4;
  QArrayData *pQVar5;
  Data *pDVar6;
  char16_t *pcVar7;
  char cVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  int i;
  ulong uVar12;
  undefined1 *puVar13;
  long in_FS_OFFSET;
  QStringView QVar14;
  QStringView QVar15;
  QAnyStringView QVar16;
  QArrayData *local_b0 [3];
  QArrayData *local_98;
  storage_type_conflict *psStack_90;
  undefined1 *local_88;
  QString local_78;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QKeySequenceEditPrivate **)(this + 8);
  uVar9 = QKeyEvent::modifiers();
  uVar3 = *(uint *)(e + 0x40);
  lVar4 = (this_00->finishingKeyCombinations).d.size;
  if (lVar4 != 0) {
    lVar11 = 0;
    do {
      if (lVar4 << 2 == lVar11) goto LAB_0040cad6;
      lVar1 = lVar11 + 4;
      puVar2 = (uint *)((long)&((this_00->finishingKeyCombinations).d.ptr)->combination + lVar11);
      lVar11 = lVar1;
    } while (*puVar2 != (uVar9 | uVar3));
    if (lVar1 != 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        QKeySequenceEditPrivate::finishEditing(this_00);
        return;
      }
      goto LAB_0040ceba;
    }
  }
LAB_0040cad6:
  if (this_00->prevKey == -1) {
    clear(this);
    this_00->prevKey = uVar3;
  }
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (storage_type_conflict *)0x0;
  local_58.d.size = 0;
  QLineEdit::setPlaceholderText(this_00->lineEdit,&local_58);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((3 < uVar3 + 0xfeffffe0) && (uVar3 != 0x1ffffff)) {
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QLineEdit::selectedText(&local_58,this_00->lineEdit);
    if ((undefined1 *)local_58.d.size == (undefined1 *)0x0) {
LAB_0040cc09:
      if (this_00->keyNum < this_00->maximumSequenceLength) {
        uVar9 = QKeyEvent::modifiers();
        if ((uVar9 >> 0x19 & 1) == 0) {
          uVar9 = QKeyEvent::modifiers();
          pQVar5 = *(QArrayData **)(e + 0x28);
          if (pQVar5 == (QArrayData *)0x0) {
            uVar9 = uVar9 & 0x1c000000 | uVar3;
          }
          else {
            LOCK();
            (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
            uVar9 = uVar9 & 0x1c000000 | uVar3;
            LOCK();
            (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQVar5,2,0x10);
            }
          }
        }
        else {
          local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_78.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          QKeyMapper::possibleKeys((QKeyEvent *)&local_78);
          uVar12 = local_78.d.size & 0xffffffff;
          uVar9 = uVar3;
          if (uVar12 != 0) {
            puVar13 = (undefined1 *)0x0;
            do {
              uVar9 = *(uint *)(local_78.d.ptr + (long)puVar13 * 2);
              iVar10 = QKeyEvent::modifiers();
              if ((uVar9 - uVar3 == iVar10) ||
                 ((uVar9 == uVar3 &&
                  (iVar10 = QKeyEvent::modifiers(), uVar9 = uVar3, iVar10 == 0x2000000))))
              goto LAB_0040cd01;
              puVar13 = puVar13 + 1;
            } while (puVar13 < (ulong)local_78.d.size);
            uVar9 = *(uint *)local_78.d.ptr;
          }
LAB_0040cd01:
          if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,4,0x10);
            }
          }
          if (uVar12 == 0) goto LAB_0040ce72;
        }
        this_00->key[this_00->keyNum].combination = uVar9;
        this_00->keyNum = this_00->keyNum + 1;
        QKeySequenceEditPrivate::rebuildKeySequence(this_00);
        local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_78.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        QKeySequence::toString((SequenceFormat)&local_78);
        if (this_00->keyNum < this_00->maximumSequenceLength) {
          QMetaObject::tr((char *)local_b0,(char *)&staticMetaObject,0x6d6840);
          QVar16.m_size = (size_t)local_b0;
          QVar16.field_0.m_data = &local_98;
          QString::arg_impl(QVar16,(int)local_78.d.ptr,(QChar)(char16_t)local_78.d.size);
          pcVar7 = local_78.d.ptr;
          pDVar6 = local_78.d.d;
          puVar13 = local_88;
          pQVar5 = local_98;
          local_98 = &(local_78.d.d)->super_QArrayData;
          local_78.d.d = (Data *)pQVar5;
          local_78.d.ptr = psStack_90;
          psStack_90 = pcVar7;
          local_88 = (undefined1 *)local_78.d.size;
          local_78.d.size = (qsizetype)puVar13;
          if (&pDVar6->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&pDVar6->super_QArrayData,2,0x10);
            }
          }
          if (local_b0[0] != (QArrayData *)0x0) {
            LOCK();
            (local_b0[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_b0[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_b0[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_b0[0],2,0x10);
            }
          }
        }
        QLineEdit::setText(this_00->lineEdit,&local_78);
        e[0xc] = (QKeyEvent)0x1;
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
    }
    else {
      QLineEdit::text(&local_78,this_00->lineEdit);
      if (local_58.d.size == local_78.d.size) {
        QVar14.m_data = local_78.d.ptr;
        QVar14.m_size = local_58.d.size;
        QVar15.m_data = local_58.d.ptr;
        QVar15.m_size = local_58.d.size;
        cVar8 = QtPrivate::equalStrings(QVar15,QVar14);
      }
      else {
        cVar8 = '\0';
      }
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((cVar8 == '\0') || (clear(this), uVar3 != 0x1000003)) goto LAB_0040cc09;
    }
LAB_0040ce72:
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0040ceba:
  __stack_chk_fail();
}

Assistant:

void QKeySequenceEdit::keyPressEvent(QKeyEvent *e)
{
    Q_D(QKeySequenceEdit);

    if (d->finishingKeyCombinations.contains(e->keyCombination())) {
        d->finishEditing();
        return;
    }

    int nextKey = e->key();

    if (d->prevKey == -1) {
        clear();
        d->prevKey = nextKey;
    }

    d->lineEdit->setPlaceholderText(QString());
    if (nextKey == Qt::Key_Control
            || nextKey == Qt::Key_Shift
            || nextKey == Qt::Key_Meta
            || nextKey == Qt::Key_Alt
            || nextKey == Qt::Key_unknown) {
        return;
    }

    QString selectedText = d->lineEdit->selectedText();
    if (!selectedText.isEmpty() && selectedText == d->lineEdit->text()) {
        clear();
        if (nextKey == Qt::Key_Backspace)
            return;
    }

    if (d->keyNum >= d->maximumSequenceLength)
        return;

    if (e->modifiers() & Qt::ShiftModifier) {
        const QList<QKeyCombination> possibleKeys = QKeyMapper::possibleKeys(e);
        int pkTotal = possibleKeys.size();
        if (!pkTotal)
            return;
        bool found = false;
        for (int i = 0; i < possibleKeys.size(); ++i) {
            const int key = possibleKeys.at(i).toCombined();
            if (key - nextKey == int(e->modifiers())
                || (key == nextKey && e->modifiers() == Qt::ShiftModifier)) {
                nextKey = key;
                found = true;
                break;
            }
        }
        // Use as fallback
        if (!found)
            nextKey = possibleKeys.first().toCombined();
    } else {
        nextKey |= d->translateModifiers(e->modifiers(), e->text());
    }


    d->key[d->keyNum] = QKeyCombination::fromCombined(nextKey);
    d->keyNum++;

    d->rebuildKeySequence();
    QString text = d->keySequence.toString(QKeySequence::NativeText);
    if (d->keyNum < d->maximumSequenceLength) {
        //: This text is an "unfinished" shortcut, expands like "Ctrl+A, ..."
        text = tr("%1, ...").arg(text);
    }
    d->lineEdit->setText(text);
    e->accept();
}